

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O2

bool operator==(wchar_t *lhs,ON_wString *rhs)

{
  bool bVar1;
  int element_count1;
  int iVar2;
  wchar_t *string2;
  
  element_count1 = ON_wString::Length(rhs);
  iVar2 = ON_wString::Length(lhs);
  if (element_count1 == iVar2) {
    string2 = ON_wString::operator_cast_to_wchar_t_(rhs);
    bVar1 = ON_wString::EqualOrdinal(lhs,element_count1,string2,element_count1,false);
    return bVar1;
  }
  return false;
}

Assistant:

bool operator==( const wchar_t* lhs, const ON_wString& rhs )
{
  const int length = rhs.Length();
  return (length == ON_wString::Length(lhs))
    && ON_wString::EqualOrdinal(
    lhs,
    length,
    static_cast<const wchar_t*>(rhs),
    length,
    false
    );
}